

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

void __thiscall VPPOperator::RenderTitle(VPPOperator *this)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  
  ImGui::SetNextItemWidth(150.0);
  fVar2 = ImGui::CalcItemWidth();
  fVar3 = ImGui::GetCursorPosX();
  ImGui::SetCursorPosX((fVar3 + (this->super_BaseNode).node_width * 0.5) - fVar2 * 0.5);
  bVar1 = ImGui::InputText("##command",&this->command,0x20,(ImGuiInputTextCallback)0x0,(void *)0x0);
  if (bVar1) {
    SetCommand(this,&this->command);
    return;
  }
  return;
}

Assistant:

virtual void RenderTitle() override
    {
        ImGui::SetNextItemWidth(150);

        float title_size = ImGui::CalcItemWidth();
        ImGui::SetCursorPosX(ImGui::GetCursorPosX() + node_width / 2.f - title_size / 2.f);

        if (ImGui::InputText("##command", &command, ImGuiInputTextFlags_EnterReturnsTrue)) {
            SetCommand(command);
        }
    }